

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O2

void __thiscall CLineInput::SetBuffer(CLineInput *this,char *pStr,int MaxSize,int MaxChars)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  undefined1 uVar5;
  
  pcVar3 = this->m_pStr;
  if (pcVar3 == (char *)0x0 || pcVar3 != pStr) {
    uVar5 = this->m_WasChanged;
    if (pcVar3 == (char *)0x0) {
      uVar5 = 0;
    }
    if (pStr == (char *)0x0) {
      uVar5 = false;
    }
    this->m_pStr = pStr;
    this->m_MaxSize = MaxSize;
    this->m_MaxChars = MaxChars;
    this->m_WasChanged = (bool)uVar5;
    if (pcVar3 == (char *)0x0) {
      this->m_ScrollOffset = 0.0;
      (this->m_CaretPosition).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
      (this->m_CaretPosition).field_1.y = 0.0;
    }
    if (pStr != (char *)0x0 && pcVar3 != pStr) {
      str_utf8_stats(this->m_pStr,this->m_MaxSize,this->m_MaxChars,&this->m_Len,&this->m_NumChars);
      iVar1 = this->m_Len;
      iVar2 = this->m_CursorPos;
      if (iVar1 < iVar2 || iVar2 < 0) {
        if (iVar2 < iVar1) {
          iVar1 = iVar2;
        }
        iVar4 = 0;
        if (-1 < iVar2) {
          iVar4 = iVar1;
        }
        this->m_CursorPos = iVar4;
        this->m_SelectionEnd = iVar4;
        this->m_SelectionStart = iVar4;
      }
      return;
    }
  }
  return;
}

Assistant:

void CLineInput::SetBuffer(char *pStr, int MaxSize, int MaxChars)
{
	if(m_pStr && m_pStr == pStr)
		return;
	const char *pLastStr = m_pStr;
	m_pStr = pStr;
	m_MaxSize = MaxSize;
	m_MaxChars = MaxChars;
	m_WasChanged = m_pStr && pLastStr && m_WasChanged;
	if(!pLastStr)
	{
		m_ScrollOffset = 0;
		m_CaretPosition = vec2(0, 0);
	}
	if(m_pStr && m_pStr != pLastStr)
		UpdateStrData();
}